

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die.cc
# Opt level: O2

void __thiscall
pstack::Dwarf::DIE::Attribute::Value::Value
          (Value *this,DWARFReader *r,FormEntry *forment,Unit *unit)

{
  Form FVar1;
  Off OVar2;
  byte bVar3;
  uint8_t uVar4;
  uint16_t uVar5;
  uint32_t uVar6;
  Exception *this_00;
  Exception *rhs;
  uintmax_t uVar7;
  undefined8 *puVar8;
  size_t len;
  size_t sStack_1f0;
  Exception local_1e8;
  string local_48;
  
  FVar1 = forment->form;
  switch(FVar1) {
  case DW_FORM_addr:
    sStack_1f0 = (size_t)unit->addrlen;
    goto LAB_0014fde4;
  case 2:
  case DW_FORM_indirect:
  case DW_FORM_ref_sup4:
  case DW_FORM_strp_sup:
  case DW_FORM_data16:
  case DW_FORM_ref_sup8:
switchD_0014fc15_caseD_2:
    this_00 = (Exception *)__cxa_allocate_exception(0x1a0);
    memset(&local_1e8,0,0x1a0);
    Exception::Exception(&local_1e8);
    std::operator<<((ostream *)&local_1e8.str,"unhandled form ");
    rhs = Exception::operator<<(&local_1e8,&forment->form);
    std::operator<<((ostream *)&rhs->str," creating value for DIE");
    Exception::Exception(this_00,rhs);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  case DW_FORM_block2:
    puVar8 = (undefined8 *)operator_new(0x10);
    *puVar8 = 0;
    puVar8[1] = 0;
    *(undefined8 **)this = puVar8;
    uVar5 = DWARFReader::getu16(r);
    uVar7 = (uintmax_t)uVar5;
    goto LAB_0014fdc1;
  case DW_FORM_block4:
    puVar8 = (undefined8 *)operator_new(0x10);
    *puVar8 = 0;
    puVar8[1] = 0;
    *(undefined8 **)this = puVar8;
    uVar6 = DWARFReader::getu32(r);
    uVar7 = (uintmax_t)uVar6;
    goto LAB_0014fdc1;
  case DW_FORM_data2:
  case DW_FORM_ref2:
  case DW_FORM_strx2:
  case DW_FORM_addrx2:
    uVar5 = DWARFReader::getu16(r);
    uVar7 = (uintmax_t)uVar5;
    break;
  case DW_FORM_data4:
  case DW_FORM_ref4:
  case DW_FORM_strx4:
  case DW_FORM_addrx4:
    uVar6 = DWARFReader::getu32(r);
    uVar7 = (uintmax_t)uVar6;
    break;
  case DW_FORM_data8:
  case DW_FORM_ref8:
  case DW_FORM_ref_sig8:
    sStack_1f0 = 8;
    goto LAB_0014fde4;
  case DW_FORM_string:
    *(Off *)this = r->off;
    DWARFReader::getstring_abi_cxx11_(&local_48,r);
    std::__cxx11::string::~string((string *)&local_48);
    return;
  case DW_FORM_block:
  case DW_FORM_exprloc:
    puVar8 = (undefined8 *)operator_new(0x10);
    *puVar8 = 0;
    puVar8[1] = 0;
    *(undefined8 **)this = puVar8;
    uVar7 = DWARFReader::getuleb128(r);
    goto LAB_0014fdc1;
  case DW_FORM_block1:
    puVar8 = (undefined8 *)operator_new(0x10);
    *puVar8 = 0;
    puVar8[1] = 0;
    *(undefined8 **)this = puVar8;
    bVar3 = DWARFReader::getu8(r);
    uVar7 = (uintmax_t)bVar3;
LAB_0014fdc1:
    *(uintmax_t *)(*(long *)this + 8) = uVar7;
    OVar2 = r->off;
    **(Off **)this = OVar2;
    r->off = OVar2 + *(long *)(*(long *)this + 8);
    return;
  case DW_FORM_data1:
  case DW_FORM_ref1:
  case DW_FORM_strx1:
  case DW_FORM_addrx1:
    bVar3 = DWARFReader::getu8(r);
    uVar7 = (uintmax_t)bVar3;
    break;
  case DW_FORM_flag:
    uVar4 = DWARFReader::getu8(r);
    *this = (Value)(uVar4 != '\0');
    return;
  case DW_FORM_sdata:
    uVar7 = DWARFReader::getsleb128(r);
    break;
  case DW_FORM_strp:
  case DW_FORM_line_strp:
    if (2 < unit->version) goto switchD_0014fc15_caseD_17;
    len = 4;
    goto LAB_0014fd0d;
  case DW_FORM_udata:
  case DW_FORM_ref_udata:
  case DW_FORM_strx:
  case DW_FORM_addrx:
  case DW_FORM_loclistx:
  case DW_FORM_rnglistx:
    uVar7 = DWARFReader::getuleb128(r);
    break;
  case DW_FORM_ref_addr:
switchD_0014fc15_caseD_10:
    sStack_1f0 = unit->dwarfLen;
    goto LAB_0014fde4;
  case DW_FORM_sec_offset:
    goto switchD_0014fc15_caseD_17;
  case DW_FORM_flag_present:
    *this = (Value)0x1;
    return;
  case DW_FORM_implicit_const:
    uVar7 = forment->value;
    break;
  case DW_FORM_strx3:
  case DW_FORM_addrx3:
    sStack_1f0 = 3;
LAB_0014fde4:
    uVar7 = DWARFReader::getuint(r,sStack_1f0);
    break;
  default:
    if (FVar1 == DW_FORM_GNU_ref_alt) goto switchD_0014fc15_caseD_10;
    if (FVar1 != DW_FORM_GNU_strp_alt) goto switchD_0014fc15_caseD_2;
    goto switchD_0014fc15_caseD_17;
  }
LAB_0014fdec:
  *(uintmax_t *)this = uVar7;
  return;
switchD_0014fc15_caseD_17:
  len = unit->dwarfLen;
LAB_0014fd0d:
  uVar7 = DWARFReader::getint(r,len);
  goto LAB_0014fdec;
}

Assistant:

DIE::Attribute::Value::Value(DWARFReader &r, const FormEntry &forment, Unit *unit)
{
    switch (forment.form) {

    case DW_FORM_GNU_strp_alt: {
        addr = r.getint(unit->dwarfLen);
        break;
    }

    case DW_FORM_strp:
    case DW_FORM_line_strp:
        addr = r.getint(unit->version <= 2 ? 4 : unit->dwarfLen);
        break;

    case DW_FORM_GNU_ref_alt:
        addr = r.getuint(unit->dwarfLen);
        break;

    case DW_FORM_addr:
        addr = r.getuint(unit->addrlen);
        break;

    case DW_FORM_data1:
        udata = r.getu8();
        break;

    case DW_FORM_data2:
        udata = r.getu16();
        break;

    case DW_FORM_data4:
        udata = r.getu32();
        break;

    case DW_FORM_data8:
        udata = r.getuint(8);
        break;

    case DW_FORM_sdata:
        sdata = r.getsleb128();
        break;

    case DW_FORM_udata:
        udata = r.getuleb128();
        break;

    // offsets in various sections...
    case DW_FORM_strx:
    case DW_FORM_loclistx:
    case DW_FORM_rnglistx:
    case DW_FORM_addrx:
    case DW_FORM_ref_udata:
        addr = r.getuleb128();
        break;

    case DW_FORM_strx1:
    case DW_FORM_addrx1:
    case DW_FORM_ref1:
        addr = r.getu8();
        break;

    case DW_FORM_strx2:
    case DW_FORM_addrx2:
    case DW_FORM_ref2:
        addr = r.getu16();
        break;

    case DW_FORM_addrx3:
    case DW_FORM_strx3:
        addr = r.getuint(3);
        break;

    case DW_FORM_strx4:
    case DW_FORM_addrx4:
    case DW_FORM_ref4:
        addr = r.getu32();
        break;

    case DW_FORM_ref_addr:
        addr = r.getuint(unit->dwarfLen);
        break;

    case DW_FORM_ref8:
        addr = r.getuint(8);
        break;

    case DW_FORM_string:
        addr = r.getOffset();
        r.getstring();
        break;

    case DW_FORM_block1:
        block = new Block();
        block->length = r.getu8();
        block->offset = r.getOffset();
        r.skip(block->length);
        break;

    case DW_FORM_block2:
        block = new Block();
        block->length = r.getu16();
        block->offset = r.getOffset();
        r.skip(block->length);
        break;

    case DW_FORM_block4:
        block = new Block();
        block->length = r.getu32();
        block->offset = r.getOffset();
        r.skip(block->length);
        break;

    case DW_FORM_exprloc:
    case DW_FORM_block:
        block = new Block();
        block->length = r.getuleb128();
        block->offset = r.getOffset();
        r.skip(block->length);
        break;

    case DW_FORM_flag:
        flag = r.getu8() != 0;
        break;

    case DW_FORM_flag_present:
        flag = true;
        break;

    case DW_FORM_sec_offset:
        addr = r.getint(unit->dwarfLen);
        break;

    case DW_FORM_ref_sig8:
        signature = r.getuint(8);
        break;

    case DW_FORM_implicit_const:
        sdata = forment.value;
        break;

    default:
        throw (Exception() << "unhandled form " << forment.form  << " creating value for DIE");
    }
}